

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
          (CreateImageFromTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  EGLImage *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_70;
  SharedPtr<tcu::ThreadUtil::Event> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_40;
  
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateImageFromTexture_003d6230;
  (this->m_texture).m_ptr = (Texture *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  (this->m_image).m_ptr = (EGLImage *)0x0;
  (this->m_image).m_state = (SharedPtrStateBase *)0x0;
  local_50.m_ptr = &texture->m_ptr->super_Object;
  local_50.m_state = texture->m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_50);
  this_00 = (EGLImage *)operator_new(0x68);
  local_60.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_60.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_70.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_70.m_state = (this->super_Operation).m_sync.m_state;
  if (local_70.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_70.m_state)->strongRefCount = (local_70.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_70.m_state)->weakRefCount = (local_70.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  EGLImage::EGLImage(this_00,&local_60,&local_70);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&local_40,this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(image,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_70);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&this->m_image,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=
            (&((this->m_texture).m_ptr)->sourceImage,&this->m_image);
  return;
}

Assistant:

CreateImageFromTexture::CreateImageFromTexture (SharedPtr<EGLImage>& image, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
{
	modifyGLObject(SharedPtr<Object>(texture));
	image = SharedPtr<EGLImage>(new EGLImage(getEvent(), getSync()));

	m_image					= image;
	m_texture				= texture;
	m_texture->sourceImage	= m_image;
}